

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall cmdline::cmdline_error::cmdline_error(cmdline_error *this,string *msg)

{
  *(undefined ***)this = &PTR__cmdline_error_0010bb60;
  std::__cxx11::string::string((string *)&this->msg,(string *)msg);
  return;
}

Assistant:

cmdline_error(const std::string &msg): msg(msg){}